

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::EnumColumnWriter::FlushPageState
          (EnumColumnWriter *this,WriteStream *temp_writer,ColumnWriterPageState *state_p)

{
  EnumWriterPageState *page_state;
  undefined1 local_1;
  
  if (*(char *)&state_p[0x105]._vptr_ColumnWriterPageState != '\0') {
    RleBpEncoder::WriteRun((RleBpEncoder *)(state_p + 1),temp_writer);
    return;
  }
  (**temp_writer->_vptr_WriteStream)(temp_writer,&local_1,1);
  return;
}

Assistant:

void EnumColumnWriter::FlushPageState(WriteStream &temp_writer, ColumnWriterPageState *state_p) {
	auto &page_state = state_p->Cast<EnumWriterPageState>();
	if (!page_state.written_value) {
		// all values are null
		// just write the bit width
		temp_writer.Write<uint8_t>(bit_width);
		return;
	}
	page_state.encoder.FinishWrite(temp_writer);
}